

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManMonitor.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::DataManMonitor::OutputJson(DataManMonitor *this,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_t vVar2;
  json_value jVar3;
  pointer pcVar4;
  bool bVar5;
  reference pvVar6;
  ostream *poVar7;
  DataManMonitor *this_00;
  json output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  ofstream file;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_320;
  string_t local_310;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2f0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2e0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2d0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2c0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2b0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2a0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_290;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_280;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_270;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_260;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_250;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_240;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_230;
  undefined1 local_220 [16];
  undefined1 local_210 [232];
  ios_base local_128 [264];
  
  local_320.m_type = null;
  local_320.m_value.object = (object_t *)0x0;
  local_230.m_type = null;
  local_230.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)7>::
  construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_230,this->m_TotalRate);
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)&local_320,"Performance");
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar6,"Bandwidth");
  vVar2 = pvVar6->m_type;
  pvVar6->m_type = local_230.m_type;
  jVar3 = pvVar6->m_value;
  (pvVar6->m_value).object = (object_t *)local_230.m_value;
  local_230.m_type = vVar2;
  local_230.m_value = jVar3;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_230);
  local_240.m_type = null;
  local_240.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)7>::
  construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_240,this->m_AccumulatedLatency / (double)(this->m_CurrentStep + 1));
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)&local_320,"Performance");
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar6,"Latency");
  vVar2 = pvVar6->m_type;
  pvVar6->m_type = local_240.m_type;
  jVar3 = pvVar6->m_value;
  (pvVar6->m_value).object = (object_t *)local_240.m_value;
  local_240.m_type = vVar2;
  local_240.m_value = jVar3;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_240);
  local_250.m_type = null;
  local_250.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)7>::
  construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_250,this->m_DropRate);
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)&local_320,"Performance");
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar6,"DropRate");
  vVar2 = pvVar6->m_type;
  pvVar6->m_type = local_250.m_type;
  jVar3 = pvVar6->m_value;
  (pvVar6->m_value).object = (object_t *)local_250.m_value;
  local_250.m_type = vVar2;
  local_250.m_value = jVar3;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_250);
  local_260.m_type = null;
  local_260.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)6>::
  construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_260,this->m_StepBytes);
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)&local_320,"Performance");
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar6,"StepDataSize");
  vVar2 = pvVar6->m_type;
  pvVar6->m_type = local_260.m_type;
  jVar3 = pvVar6->m_value;
  (pvVar6->m_value).object = (object_t *)local_260.m_value;
  local_260.m_type = vVar2;
  local_260.m_value = jVar3;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_260);
  local_270.m_type = null;
  local_270.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)7>::
  construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_270,(double)this->m_RequiredAccuracy);
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)&local_320,"Performance");
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar6,"AllowedError");
  vVar2 = pvVar6->m_type;
  pvVar6->m_type = local_270.m_type;
  jVar3 = pvVar6->m_value;
  (pvVar6->m_value).object = (object_t *)local_270.m_value;
  local_270.m_type = vVar2;
  local_270.m_value = jVar3;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_270);
  local_280.m_type = null;
  local_280.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)6>::
  construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_280,this->m_CombiningSteps);
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)&local_320,"Decisions");
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar6,"CombiningSteps");
  vVar2 = pvVar6->m_type;
  pvVar6->m_type = local_280.m_type;
  jVar3 = pvVar6->m_value;
  (pvVar6->m_value).object = (object_t *)local_280.m_value;
  local_280.m_type = vVar2;
  local_280.m_value = jVar3;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_280);
  local_290.m_type = null;
  local_290.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)4>::
  construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_290,this->m_ReaderThreading);
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)&local_320,"Decisions");
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar6,"ReaderThreading");
  vVar2 = pvVar6->m_type;
  pvVar6->m_type = local_290.m_type;
  jVar3 = pvVar6->m_value;
  (pvVar6->m_value).object = (object_t *)local_290.m_value;
  local_290.m_type = vVar2;
  local_290.m_value = jVar3;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_290);
  local_2a0.m_type = null;
  local_2a0.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)4>::
  construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_2a0,this->m_WriterThreading);
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)&local_320,"Decisions");
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar6,"WriterThreading");
  vVar2 = pvVar6->m_type;
  pvVar6->m_type = local_2a0.m_type;
  jVar3 = pvVar6->m_value;
  (pvVar6->m_value).object = (object_t *)local_2a0.m_value;
  local_2a0.m_type = vVar2;
  local_2a0.m_value = jVar3;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_2a0);
  local_2e0.m_value.object = (object_t *)0x0;
  local_2e0.m_type = string;
  local_2e0.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
       ::create<std::__cxx11::string,std::__cxx11::string_const&>(&this->m_TransportMethod);
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)&local_320,"Decisions");
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar6,"Transport");
  vVar2 = pvVar6->m_type;
  pvVar6->m_type = local_2e0.m_type;
  jVar3 = pvVar6->m_value;
  (pvVar6->m_value).object = (object_t *)local_2e0.m_value;
  local_2e0.m_type = vVar2;
  local_2e0.m_value = jVar3;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_2e0);
  if ((this->m_CompressionMethod)._M_string_length != 0) {
    local_2f0.m_value.object = (object_t *)0x0;
    local_2f0.m_type = string;
    local_2f0.m_value.object =
         (object_t *)
         nlohmann::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
         ::create<std::__cxx11::string,std::__cxx11::string_const&>(&this->m_CompressionMethod);
    pvVar6 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&local_320,"Decisions");
    pvVar6 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)pvVar6,"CompressionMethod");
    vVar2 = pvVar6->m_type;
    pvVar6->m_type = local_2f0.m_type;
    jVar3 = pvVar6->m_value;
    (pvVar6->m_value).object = (object_t *)local_2f0.m_value;
    local_2f0.m_type = vVar2;
    local_2f0.m_value = jVar3;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_2f0);
    local_2b0.m_type = null;
    local_2b0.m_value.object = (object_t *)0x0;
    nlohmann::detail::external_constructor<(nlohmann::detail::value_t)7>::
    construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (&local_2b0,(double)this->m_CompressionAccuracy);
    pvVar6 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&local_320,"Decisions");
    pvVar6 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)pvVar6,"CompressionAccuracy");
    vVar2 = pvVar6->m_type;
    pvVar6->m_type = local_2b0.m_type;
    jVar3 = pvVar6->m_value;
    (pvVar6->m_value).object = (object_t *)local_2b0.m_value;
    local_2b0.m_type = vVar2;
    local_2b0.m_value = jVar3;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_2b0);
  }
  local_2c0.m_type = null;
  local_2c0.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)7>::
  construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_2c0,this->m_RoundLatency);
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)&local_320,"Info");
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar6,"RoundLatency");
  vVar2 = pvVar6->m_type;
  pvVar6->m_type = local_2c0.m_type;
  jVar3 = pvVar6->m_value;
  (pvVar6->m_value).object = (object_t *)local_2c0.m_value;
  local_2c0.m_type = vVar2;
  local_2c0.m_value = jVar3;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_2c0);
  local_2d0.m_type = null;
  local_2d0.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)6>::
  construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_2d0,this->m_ClockError);
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)&local_320,"Info");
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar6,"ClockError");
  vVar2 = pvVar6->m_type;
  pvVar6->m_type = local_2d0.m_type;
  jVar3 = pvVar6->m_value;
  (pvVar6->m_value).object = (object_t *)local_2d0.m_value;
  local_2d0.m_type = vVar2;
  local_2d0.m_value = jVar3;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_2d0);
  pcVar4 = (filename->_M_dataplus)._M_p;
  local_220._0_8_ = local_210;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_220,pcVar4,pcVar4 + filename->_M_string_length);
  this_00 = (DataManMonitor *)local_220;
  std::__cxx11::string::append((char *)this_00);
  bVar5 = FileExisted(this_00,(string *)local_220);
  if ((undefined1 *)local_220._0_8_ != local_210) {
    operator_delete((void *)local_220._0_8_);
  }
  paVar1 = &local_310.field_2;
  pcVar4 = (filename->_M_dataplus)._M_p;
  local_310._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_310,pcVar4,pcVar4 + filename->_M_string_length);
  std::__cxx11::string::append((char *)&local_310);
  std::ofstream::ofstream(local_220,local_310._M_dataplus._M_p,_S_out|_S_app);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != paVar1) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  if (!bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_220,"ADOPS2 DataMan performance measurements",0x27);
    std::ios::widen((char)(ostream *)local_220 + (char)*(undefined8 *)(local_220._0_8_ + -0x18));
    std::ostream::put((char)local_220);
    std::ostream::flush();
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::dump(&local_310,&local_320,-1,' ',false,strict);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_220,local_310._M_dataplus._M_p,local_310._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"",0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != paVar1) {
    operator_delete(local_310._M_dataplus._M_p);
  }
  std::ofstream::close();
  local_220._0_8_ = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18)) = _pthread_rwlock_init;
  std::filebuf::~filebuf((filebuf *)(local_220 + 8));
  std::ios_base::~ios_base(local_128);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_320);
  return;
}

Assistant:

void DataManMonitor::OutputJson(const std::string &filename)
{
    nlohmann::json output;

    output["Performance"]["Bandwidth"] = m_TotalRate;
    output["Performance"]["Latency"] =
        m_AccumulatedLatency / static_cast<double>(m_CurrentStep + 1);
    output["Performance"]["DropRate"] = m_DropRate;
    output["Performance"]["StepDataSize"] = m_StepBytes;
    output["Performance"]["AllowedError"] = m_RequiredAccuracy;

    output["Decisions"]["CombiningSteps"] = m_CombiningSteps;
    output["Decisions"]["ReaderThreading"] = m_ReaderThreading;
    output["Decisions"]["WriterThreading"] = m_WriterThreading;
    output["Decisions"]["Transport"] = m_TransportMethod;
    if (!m_CompressionMethod.empty())
    {
        output["Decisions"]["CompressionMethod"] = m_CompressionMethod;
        output["Decisions"]["CompressionAccuracy"] = m_CompressionAccuracy;
    }

    output["Info"]["RoundLatency"] = m_RoundLatency;
    output["Info"]["ClockError"] = m_ClockError;

    bool fileExists = FileExisted(filename + ".json");

    std::ofstream file((filename + ".json").c_str(), std::fstream::out | std::fstream::app);
    if (!fileExists)
    {
        file << "ADOPS2 DataMan performance measurements" << std::endl;
    }
    file << output.dump() << "\0" << std::endl;
    file.close();
}